

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall YAML::Parser::HandleTagDirective(Parser *this,Token *token)

{
  key_type *__k;
  Directives *pDVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  ParserException *pPVar4;
  allocator local_41;
  string local_40;
  
  __k = (token->params).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(token->params).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)__k != 0x40) {
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x40);
    std::__cxx11::string::string
              ((string *)&local_40,"TAG directives must have exactly two arguments",&local_41);
    ParserException::ParserException(pPVar4,&token->mark,&local_40);
    __cxa_throw(pPVar4,&ParserException::typeinfo,BadConversion::~BadConversion);
  }
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(((this->m_pDirectives)._M_t.
                    super___uniq_ptr_impl<YAML::Directives,_std::default_delete<YAML::Directives>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_YAML::Directives_*,_std::default_delete<YAML::Directives>_>
                    .super__Head_base<0UL,_YAML::Directives_*,_false>._M_head_impl)->tags)._M_t,__k)
  ;
  pDVar1 = (this->m_pDirectives)._M_t.
           super___uniq_ptr_impl<YAML::Directives,_std::default_delete<YAML::Directives>_>._M_t.
           super__Tuple_impl<0UL,_YAML::Directives_*,_std::default_delete<YAML::Directives>_>.
           super__Head_base<0UL,_YAML::Directives_*,_false>._M_head_impl;
  if (iVar2._M_node == (_Base_ptr)((long)&(pDVar1->tags)._M_t + 8U)) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pDVar1->tags,__k);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    return;
  }
  pPVar4 = (ParserException *)__cxa_allocate_exception(0x40);
  std::__cxx11::string::string((string *)&local_40,"repeated TAG directive",&local_41);
  ParserException::ParserException(pPVar4,&token->mark,&local_40);
  __cxa_throw(pPVar4,&ParserException::typeinfo,BadConversion::~BadConversion);
}

Assistant:

void Parser::HandleTagDirective(const Token& token) {
  if (token.params.size() != 2)
    throw ParserException(token.mark, ErrorMsg::TAG_DIRECTIVE_ARGS);

  const std::string& handle = token.params[0];
  const std::string& prefix = token.params[1];
  if (m_pDirectives->tags.find(handle) != m_pDirectives->tags.end()) {
    throw ParserException(token.mark, ErrorMsg::REPEATED_TAG_DIRECTIVE);
  }

  m_pDirectives->tags[handle] = prefix;
}